

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

uint TryLowerConstantToMemory(RegVmLoweredBlock *lowBlock,VmValue *value)

{
  VmValueType VVar1;
  uint uVar2;
  RegVmLoweredModule *this;
  uint uVar3;
  uint *val;
  uint i;
  ulong uVar4;
  uint data [2];
  undefined8 local_38;
  uint local_2c;
  
  val = (uint *)&local_38;
  if (value == (VmValue *)0x0) {
    return 0;
  }
  if (value->typeID != 1) {
    return 0;
  }
  this = lowBlock->parent->parent;
  VVar1 = (value->type).type;
  uVar3 = (value->type).size;
  if ((VVar1 == VM_TYPE_INT) && (uVar3 == 4)) {
    uVar3 = RegVmLoweredModule::FindConstant(this,*(uint *)&value[1]._vptr_VmValue);
    if (uVar3 != 0) {
      return uVar3;
    }
    uVar3 = (this->constants).count;
    local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)&value[1]._vptr_VmValue);
  }
  else {
    if ((VVar1 == VM_TYPE_DOUBLE) && (uVar3 == 8)) {
      local_38 = *(undefined8 *)&value[1].typeID;
    }
    else {
      if ((VVar1 != VM_TYPE_LONG) || (uVar3 != 8)) {
        if (VVar1 == VM_TYPE_STRUCT) {
          if ((uVar3 & 3) == 0) {
            uVar2 = (this->constants).count;
            for (uVar4 = 0; uVar4 < uVar3 >> 2; uVar4 = uVar4 + 1) {
              local_38 = CONCAT44(local_38._4_4_,
                                  *(undefined4 *)
                                   ((long)&(value[1].type.structType)->_vptr_TypeBase + uVar4 * 4));
              SmallArray<unsigned_int,_256U>::push_back(&this->constants,(uint *)&local_38);
              uVar3 = (value->type).size;
            }
            return uVar2 + 1;
          }
          __assert_fail("constant->type.size % 4 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0x22f,
                        "unsigned int TryLowerConstantToMemory(RegVmLoweredBlock *, VmValue *)");
        }
        if (VVar1 != VM_TYPE_POINTER) {
          return 0;
        }
        if (value[1].comment.end != (char *)0x0) {
          return 0;
        }
        if (*(int *)&value[1]._vptr_VmValue != 0) {
          __assert_fail("constant->iValue == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0x219,
                        "unsigned int TryLowerConstantToMemory(RegVmLoweredBlock *, VmValue *)");
        }
      }
      local_38._0_4_ = value[1].type.type;
      local_38._4_4_ = value[1].type.size;
    }
    uVar3 = RegVmLoweredModule::FindConstant(this,(uint)local_38,(uint)((ulong)local_38 >> 0x20));
    if (uVar3 != 0) {
      return uVar3;
    }
    val = (uint *)((long)&local_38 + 4);
    uVar3 = (this->constants).count;
    if ((uVar3 & 1) != 0) {
      local_2c = 0;
      SmallArray<unsigned_int,_256U>::push_back(&this->constants,&local_2c);
      uVar3 = (this->constants).count;
    }
    SmallArray<unsigned_int,_256U>::push_back(&this->constants,(uint *)&local_38);
  }
  SmallArray<unsigned_int,_256U>::push_back(&this->constants,val);
  return uVar3 + 1;
}

Assistant:

unsigned TryLowerConstantToMemory(RegVmLoweredBlock *lowBlock, VmValue *value)
{
	if(VmConstant *constant = getType<VmConstant>(value))
	{
		RegVmLoweredModule *lowModule = lowBlock->parent->parent;

		if(constant->type == VmType::Int || (constant->type.type == VM_TYPE_POINTER && NULLC_PTR_SIZE == 4 && !constant->container))
		{
			if(constant->type.type == VM_TYPE_POINTER)
				assert(constant->iValue == 0);

			if(unsigned index = lowModule->FindConstant(constant->iValue))
				return index;

			unsigned index = lowModule->constants.size() + 1;

			lowModule->constants.push_back(constant->iValue);

			return index;
		}
		else if(constant->type == VmType::Double)
		{
			unsigned data[2];
			memcpy(data, &constant->dValue, 8);

			if(unsigned index = lowModule->FindConstant(data[0], data[1]))
				return index;

			if(lowModule->constants.size() % 2 != 0)
				lowModule->constants.push_back(0);

			unsigned index = lowModule->constants.size() + 1;

			lowModule->constants.push_back(data[0]);
			lowModule->constants.push_back(data[1]);

			return index;
		}
		else if(constant->type == VmType::Long || (constant->type.type == VM_TYPE_POINTER && NULLC_PTR_SIZE == 8 && !constant->container))
		{
			if(constant->type.type == VM_TYPE_POINTER)
				assert(constant->iValue == 0);

			unsigned data[2];
			memcpy(data, &constant->lValue, 8);

			if(unsigned index = lowModule->FindConstant(data[0], data[1]))
				return index;

			if(lowModule->constants.size() % 2 != 0)
				lowModule->constants.push_back(0);

			unsigned index = lowModule->constants.size() + 1;

			lowModule->constants.push_back(data[0]);
			lowModule->constants.push_back(data[1]);

			return index;
		}
		else if(constant->type.type == VM_TYPE_STRUCT)
		{
			unsigned index = lowModule->constants.size() + 1;

			assert(constant->type.size % 4 == 0);

			for(unsigned i = 0; i < constant->type.size / 4; i++)
			{
				unsigned elementValue;
				memcpy(&elementValue, constant->sValue + i * 4, 4);
				lowModule->constants.push_back(elementValue);
			}

			return index;
		}
	}

	return 0;
}